

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

PolicyID policyForString(char *policy_id)

{
  int iVar1;
  char *policy_id_local;
  
  iVar1 = strcmp(policy_id,"CMP0003");
  if (iVar1 == 0) {
    policy_id_local._4_4_ = CMP0003;
  }
  else {
    iVar1 = strcmp(policy_id,"CMP0004");
    if (iVar1 == 0) {
      policy_id_local._4_4_ = CMP0004;
    }
    else {
      iVar1 = strcmp(policy_id,"CMP0008");
      if (iVar1 == 0) {
        policy_id_local._4_4_ = CMP0008;
      }
      else {
        iVar1 = strcmp(policy_id,"CMP0020");
        if (iVar1 == 0) {
          policy_id_local._4_4_ = CMP0020;
        }
        else {
          iVar1 = strcmp(policy_id,"CMP0021");
          if (iVar1 == 0) {
            policy_id_local._4_4_ = CMP0021;
          }
          else {
            iVar1 = strcmp(policy_id,"CMP0022");
            if (iVar1 == 0) {
              policy_id_local._4_4_ = CMP0022;
            }
            else {
              iVar1 = strcmp(policy_id,"CMP0027");
              if (iVar1 == 0) {
                policy_id_local._4_4_ = CMP0027;
              }
              else {
                iVar1 = strcmp(policy_id,"CMP0038");
                if (iVar1 == 0) {
                  policy_id_local._4_4_ = CMP0038;
                }
                else {
                  iVar1 = strcmp(policy_id,"CMP0041");
                  if (iVar1 == 0) {
                    policy_id_local._4_4_ = CMP0041;
                  }
                  else {
                    iVar1 = strcmp(policy_id,"CMP0042");
                    if (iVar1 == 0) {
                      policy_id_local._4_4_ = CMP0042;
                    }
                    else {
                      iVar1 = strcmp(policy_id,"CMP0046");
                      if (iVar1 == 0) {
                        policy_id_local._4_4_ = CMP0046;
                      }
                      else {
                        iVar1 = strcmp(policy_id,"CMP0052");
                        if (iVar1 == 0) {
                          policy_id_local._4_4_ = CMP0052;
                        }
                        else {
                          iVar1 = strcmp(policy_id,"CMP0060");
                          if (iVar1 == 0) {
                            policy_id_local._4_4_ = CMP0060;
                          }
                          else {
                            iVar1 = strcmp(policy_id,"CMP0063");
                            if (iVar1 == 0) {
                              policy_id_local._4_4_ = CMP0063;
                            }
                            else {
                              iVar1 = strcmp(policy_id,"CMP0065");
                              if (iVar1 == 0) {
                                policy_id_local._4_4_ = CMP0065;
                              }
                              else {
                                iVar1 = strcmp(policy_id,"CMP0068");
                                if (iVar1 == 0) {
                                  policy_id_local._4_4_ = CMP0068;
                                }
                                else {
                                  iVar1 = strcmp(policy_id,"CMP0069");
                                  if (iVar1 != 0) {
                                    __assert_fail("false && \"Unreachable code. Not a valid policy\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                                  ,0x593,
                                                  "cmPolicies::PolicyID policyForString(const char *)"
                                                 );
                                  }
                                  policy_id_local._4_4_ = CMP0069;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return policy_id_local._4_4_;
}

Assistant:

cmPolicies::PolicyID policyForString(const char* policy_id)
{
#define RETURN_POLICY_ID(POLICY_ID)                                           \
  if (strcmp(policy_id, #POLICY_ID) == 0) {                                   \
    return cmPolicies::POLICY_ID;                                             \
  }

  CM_FOR_EACH_TARGET_POLICY(RETURN_POLICY_ID)

#undef RETURN_POLICY_ID

  assert(false && "Unreachable code. Not a valid policy");
  return cmPolicies::CMP0002;
}